

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.yy.c
# Opt level: O0

int coda_expression_lex_init_extra(void *yy_user_defined,yyscan_t *ptr_yy_globals)

{
  int *piVar1;
  char *pcVar2;
  undefined1 local_b8 [8];
  yyguts_t dummy_yyguts;
  yyscan_t *ptr_yy_globals_local;
  void *yy_user_defined_local;
  
  dummy_yyguts.yylval_r = (YYSTYPE *)ptr_yy_globals;
  coda_expression_set_extra(yy_user_defined,local_b8);
  if (dummy_yyguts.yylval_r == (YYSTYPE *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    yy_user_defined_local._4_4_ = 1;
  }
  else {
    pcVar2 = (char *)coda_expression_alloc(0x98,local_b8);
    (dummy_yyguts.yylval_r)->stringval = pcVar2;
    if ((dummy_yyguts.yylval_r)->stringval == (char *)0x0) {
      piVar1 = __errno_location();
      *piVar1 = 0xc;
      yy_user_defined_local._4_4_ = 1;
    }
    else {
      memset((dummy_yyguts.yylval_r)->stringval,0,0x98);
      coda_expression_set_extra(yy_user_defined,(dummy_yyguts.yylval_r)->stringval);
      yy_user_defined_local._4_4_ = yy_init_globals((dummy_yyguts.yylval_r)->stringval);
    }
  }
  return yy_user_defined_local._4_4_;
}

Assistant:

int yylex_init_extra( YY_EXTRA_TYPE yy_user_defined, yyscan_t* ptr_yy_globals )
{
    struct yyguts_t dummy_yyguts;

    yyset_extra (yy_user_defined, &dummy_yyguts);

    if (ptr_yy_globals == NULL){
        errno = EINVAL;
        return 1;
    }

    *ptr_yy_globals = (yyscan_t) yyalloc ( sizeof( struct yyguts_t ), &dummy_yyguts );

    if (*ptr_yy_globals == NULL){
        errno = ENOMEM;
        return 1;
    }

    /* By setting to 0xAA, we expose bugs in
    yy_init_globals. Leave at 0x00 for releases. */
    memset(*ptr_yy_globals,0x00,sizeof(struct yyguts_t));

    yyset_extra (yy_user_defined, *ptr_yy_globals);

    return yy_init_globals ( *ptr_yy_globals );
}